

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_allEqual_bvec2(ShaderEvalContext *c)

{
  bool bVar1;
  bool bVar2;
  bool *pbVar3;
  bool *pbVar4;
  bool bVar5;
  bool local_4;
  bool local_3;
  bool local_2;
  bool local_1;
  
  local_1 = 0.0 < c->in[0].m_data[3];
  local_2 = 0.0 < c->in[0].m_data[1];
  local_3 = 0.0 < c->in[1].m_data[1];
  local_4 = 0.0 < c->in[1].m_data[0];
  bVar5 = true;
  pbVar3 = &local_1;
  pbVar4 = &local_3;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    if (bVar5) {
      bVar5 = *pbVar3 == *pbVar4;
    }
    else {
      bVar5 = false;
    }
    pbVar3 = &local_2;
    pbVar4 = &local_4;
    bVar1 = false;
  } while (bVar2);
  (c->color).m_data[0] = (float)bVar5;
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }